

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O3

SpatialInertia * iDynTree::getRandomInertia(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SpatialInertia *in_RDI;
  double dVar5;
  double dVar6;
  Rotation rot;
  Position local_160;
  double local_148 [5];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  double local_108;
  RotationalInertia local_100;
  RotationalInertia local_b8;
  Rotation local_70;
  
  iVar1 = rand();
  dVar6 = ((double)iVar1 * 3.0) / 2147483647.0 + 0.0;
  iVar1 = rand();
  dVar5 = ((double)iVar1 * 4.0) / 2147483647.0 + 0.0;
  iVar1 = rand();
  local_148[4] = ((double)iVar1 * 6.0) / 2147483647.0 + 0.0;
  local_148[0] = dVar5 + local_148[4];
  local_148[4] = local_148[4] + dVar6;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  local_148[3] = 0.0;
  local_108 = dVar5 + dVar6;
  local_120 = 0;
  uStack_118 = 0;
  local_110 = 0;
  iVar1 = rand();
  iVar2 = rand();
  iVar3 = rand();
  Rotation::RPY(&local_70,(double)iVar1 / 2147483647.0 + 0.0,
                ((double)iVar2 + (double)iVar2) / 2147483647.0 + -1.0,
                (double)iVar3 / 2147483647.0 + 0.0);
  iVar1 = rand();
  iVar2 = rand();
  iVar3 = rand();
  iVar4 = rand();
  Position::Position(&local_160,((double)iVar2 * 4.0) / 2147483647.0 + -2.0,
                     ((double)iVar3 * 4.0) / 2147483647.0 + -2.0,
                     ((double)iVar4 * 4.0) / 2147483647.0 + -2.0);
  RotationalInertia::RotationalInertia(&local_100,local_148,3,3);
  Rotation::operator*(&local_b8,&local_70,&local_100);
  SpatialInertia::SpatialInertia
            (in_RDI,((double)iVar1 * 4.0) / 2147483647.0 + 0.0,&local_160,&local_b8);
  return in_RDI;
}

Assistant:

SpatialInertia getRandomInertia()
{
    double cxx = getRandomDouble(0,3);
    double cyy = getRandomDouble(0,4);
    double czz = getRandomDouble(0,6);
    double rotInertiaData[3*3] = {czz+cyy,0.0,0.0,
                                  0.0,cxx+czz,0.0,
                                  0.0,0.0,cxx+cyy};

    Rotation rot = Rotation::RPY(getRandomDouble(),getRandomDouble(-1,1),getRandomDouble());

    SpatialInertia inertiaLink(getRandomDouble(0,4),
                               Position(getRandomDouble(-2,2),getRandomDouble(-2,2),getRandomDouble(-2,2)),
                               rot*RotationalInertia(rotInertiaData,3,3));

    return inertiaLink;
}